

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_run.c
# Opt level: O0

fork_status srunner_fork_status(SRunner *sr)

{
  int iVar1;
  char *__s1;
  char *env;
  SRunner *sr_local;
  
  if (sr->fstat == CK_FORK_GETENV) {
    __s1 = getenv("CK_FORK");
    if (__s1 == (char *)0x0) {
      sr_local._4_4_ = CK_FORK;
    }
    else {
      iVar1 = strcmp(__s1,"no");
      if (iVar1 == 0) {
        sr_local._4_4_ = CK_NOFORK;
      }
      else {
        sr_local._4_4_ = CK_FORK;
      }
    }
  }
  else {
    sr_local._4_4_ = sr->fstat;
  }
  return sr_local._4_4_;
}

Assistant:

enum fork_status srunner_fork_status(SRunner * sr)
{
    if(sr->fstat == CK_FORK_GETENV)
    {
        char *env = getenv("CK_FORK");

        if(env == NULL)
#if defined(HAVE_FORK) && HAVE_FORK==1
            return CK_FORK;
#else
            return CK_NOFORK;
#endif
        if(strcmp(env, "no") == 0)
            return CK_NOFORK;
#if defined(HAVE_FORK) && HAVE_FORK==1
        return CK_FORK;
#else /* HAVE_FORK */
        /* Ignoring, as Check is not compiled with fork support. */
        return CK_NOFORK;
#endif /* HAVE_FORK */
    }
    return sr->fstat;
}